

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poppify.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_13::Poppifier::emitScopeEnd(Poppifier *this,Expression *curr)

{
  reference pvVar1;
  Loop *pLVar2;
  If *pIVar3;
  Try *pTVar4;
  Expression **expr;
  Expression *local_18;
  Expression *curr_local;
  Poppifier *this_local;
  
  local_18 = curr;
  curr_local = (Expression *)this;
  pvVar1 = std::
           vector<wasm::(anonymous_namespace)::Poppifier::Scope,_std::allocator<wasm::(anonymous_namespace)::Poppifier::Scope>_>
           ::back(&this->scopeStack);
  switch(pvVar1->kind) {
  case Func:
    handle_unreachable("unexpected end of function",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Poppify.cpp"
                       ,0x12f);
  case Block:
    patchScope(this,&local_18);
    break;
  case Loop:
    pLVar2 = Expression::cast<wasm::Loop>(local_18);
    patchScope(this,&pLVar2->body);
    break;
  case If:
    pIVar3 = Expression::cast<wasm::If>(local_18);
    patchScope(this,&pIVar3->ifTrue);
    break;
  case Else:
    pIVar3 = Expression::cast<wasm::If>(local_18);
    patchScope(this,&pIVar3->ifFalse);
    break;
  case Try:
    handle_unreachable("try without catch",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Poppify.cpp"
                       ,0x12d);
  case Catch:
    pTVar4 = Expression::cast<wasm::Try>(local_18);
    expr = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                     (&(pTVar4->catchBodies).
                       super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    patchScope(this,expr);
  }
  pvVar1 = std::
           vector<wasm::(anonymous_namespace)::Poppifier::Scope,_std::allocator<wasm::(anonymous_namespace)::Poppifier::Scope>_>
           ::back(&this->scopeStack);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
            (&pvVar1->instrs,&local_18);
  return;
}

Assistant:

void Poppifier::emitScopeEnd(Expression* curr) {
  switch (scopeStack.back().kind) {
    case Scope::Block:
      patchScope(curr);
      break;
    case Scope::Loop:
      patchScope(curr->cast<Loop>()->body);
      break;
    case Scope::If:
      patchScope(curr->cast<If>()->ifTrue);
      break;
    case Scope::Else:
      patchScope(curr->cast<If>()->ifFalse);
      break;
    case Scope::Catch:
      patchScope(curr->cast<Try>()->catchBodies.back());
      break;
    case Scope::Try:
      WASM_UNREACHABLE("try without catch");
    case Scope::Func:
      WASM_UNREACHABLE("unexpected end of function");
  }
  scopeStack.back().instrs.push_back(curr);
}